

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

void __thiscall QPropertyBindingPrivate::clearDependencyObservers(QPropertyBindingPrivate *this)

{
  long lVar1;
  vector<QPropertyObserver,_std::allocator<QPropertyObserver>_> *this_00;
  ulong uVar2;
  size_t i;
  ulong __n;
  long in_FS_OFFSET;
  QPropertyObserverPointer p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = 0;
  while( true ) {
    uVar2 = this->dependencyObserverCount;
    if (3 < this->dependencyObserverCount) {
      uVar2 = 4;
    }
    if (uVar2 <= __n) break;
    p.ptr = (QPropertyObserver *)&DAT_aaaaaaaaaaaaaaaa;
    p.ptr = std::array<QPropertyObserver,_4UL>::operator[](&this->inlineDependencyObservers,__n);
    QPropertyObserverPointer::unlink_common(&p);
    __n = __n + 1;
  }
  this_00 = (this->heapObservers)._M_t.
            super___uniq_ptr_impl<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>,_std::default_delete<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_*,_std::default_delete<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_>_>
            .
            super__Head_base<0UL,_std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_*,_false>
            ._M_head_impl;
  if (this_00 != (vector<QPropertyObserver,_std::allocator<QPropertyObserver>_> *)0x0) {
    std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>::clear(this_00);
  }
  this->dependencyObserverCount = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPropertyBindingPrivate::clearDependencyObservers() {
    for (size_t i = 0; i < qMin(dependencyObserverCount, inlineDependencyObservers.size()); ++i) {
        QPropertyObserverPointer p{&inlineDependencyObservers[i]};
        p.unlink_fast();
    }
    if (heapObservers)
        heapObservers->clear();
    dependencyObserverCount = 0;
}